

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O3

int foreach(lua_State *L)

{
  int iVar1;
  
  luaL_checktype(L,1,5);
  luaL_checktype(L,2,6);
  lua_pushnil(L);
  iVar1 = lua_next(L,1);
  while( true ) {
    if (iVar1 == 0) {
      return 0;
    }
    lua_pushvalue(L,2);
    lua_pushvalue(L,-3);
    lua_pushvalue(L,-3);
    lua_call(L,2,1);
    iVar1 = lua_type(L,-1);
    if (iVar1 != 0) break;
    lua_settop(L,-3);
    iVar1 = lua_next(L,1);
  }
  return 1;
}

Assistant:

static int foreach (lua_State *L) {
  luaL_checktype(L, 1, LUA_TTABLE);
  luaL_checktype(L, 2, LUA_TFUNCTION);
  lua_pushnil(L);  /* first key */
  while (lua_next(L, 1)) {
    lua_pushvalue(L, 2);  /* function */
    lua_pushvalue(L, -3);  /* key */
    lua_pushvalue(L, -3);  /* value */
    lua_call(L, 2, 1);
    if (!lua_isnil(L, -1))
      return 1;
    lua_pop(L, 2);  /* remove value and result */
  }
  return 0;
}